

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Maybe<kj::Promise<void_*>_> __thiscall
capnp::LocalClient::getLocalServer(LocalClient *this,CapabilityServerSetBase *capServerSet)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 extraout_RDX;
  PromiseBase *this_00;
  Maybe<kj::Promise<void_*>_> MVar1;
  PromiseBase local_30;
  PromiseBase local_28;
  CapabilityServerSetBase *local_20;
  
  if (*(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 *)(capServerSet + 0x30) ==
      in_RDX) {
    if (capServerSet[0x78] == (CapabilityServerSetBase)0x1) {
      kj::newAdaptedPromise<kj::Promise<void>,capnp::LocalClient::BlockedCall,capnp::LocalClient&>
                ((kj *)&local_30,(LocalClient *)capServerSet);
      local_20 = capServerSet;
      kj::Promise<void>::
      then<capnp::LocalClient::getLocalServer(capnp::_::CapabilityServerSetBase&)::_lambda()_1_>
                ((Promise<void> *)&local_28,(anon_class_8_1_8991fb9c_for_func *)&local_30);
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      (this->super_ClientHook).brand = (void *)local_28.node.ptr;
      local_28.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28.node);
      this_00 = &local_30;
    }
    else {
      this_00 = &local_28;
      kj::Promise<void_*>::Promise
                ((Promise<void_*> *)this_00,*(FixVoid<void_*> *)(capServerSet + 0x38));
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      (this->super_ClientHook).brand = (void *)local_28.node.ptr;
      local_28.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    }
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&this_00->node);
    in_RDX = extraout_RDX;
  }
  else {
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
  }
  MVar1.ptr.field_1 = in_RDX;
  MVar1.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void_*>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void*>> getLocalServer(_::CapabilityServerSetBase& capServerSet) {
    // If this is a local capability created through `capServerSet`, return the underlying Server.
    // Otherwise, return nullptr. Default implementation (which everyone except LocalClient should
    // use) always returns nullptr.

    if (this->capServerSet == &capServerSet) {
      if (blocked) {
        // If streaming calls are in-flight, it could be the case that they were originally sent
        // over RPC and reflected back, before the capability had resolved to a local object. In
        // that case, the client may already perceive these calls as "done" because the RPC
        // implementation caused the client promise to resolve early. However, the capability is
        // now local, and the app is trying to break through the LocalClient wrapper and access
        // the server directly, bypassing the stream queue. Since the app thinks that all
        // previous calls already completed, it may then try to queue a new call directly on the
        // server, jumping the queue.
        //
        // We can solve this by delaying getLocalServer() until all current streaming calls have
        // finished. Note that if a new streaming call is started *after* this point, we need not
        // worry about that, because in this case it is presumably a local call and the caller
        // won't be informed of completion until the call actually does complete. Thus the caller
        // is well-aware that this call is still in-flight.
        //
        // However, the app still cannot assume that there aren't multiple clients, perhaps even
        // a malicious client that tries to send stream requests that overlap with the app's
        // direct use of the server... so it's up to the app to check for and guard against
        // concurrent calls after using getLocalServer().
        return kj::newAdaptedPromise<kj::Promise<void>, BlockedCall>(*this)
            .then([this]() { return ptr; });
      } else {
        return kj::Promise<void*>(ptr);
      }
    } else {
      return kj::none;
    }
  }